

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O1

void Wlc_NtkAbsAddToNodeFrames(Vec_Int_t *vNodeFrames,Vec_Int_t *vLevel)

{
  long lVar1;
  long lVar2;
  
  if (0 < vLevel->nSize) {
    lVar2 = 0;
    do {
      if (0 < (long)vNodeFrames->nSize) {
        lVar1 = 0;
        do {
          if (vNodeFrames->pArray[lVar1] == vLevel->pArray[lVar2]) goto LAB_0035d9d8;
          lVar1 = lVar1 + 1;
        } while (vNodeFrames->nSize != lVar1);
      }
      Vec_IntPush(vNodeFrames,vLevel->pArray[lVar2]);
LAB_0035d9d8:
      lVar2 = lVar2 + 1;
    } while (lVar2 < vLevel->nSize);
  }
  qsort(vNodeFrames->pArray,(long)vNodeFrames->nSize,4,Vec_IntSortCompare1);
  return;
}

Assistant:

void Wlc_NtkAbsAddToNodeFrames( Vec_Int_t * vNodeFrames, Vec_Int_t * vLevel ) 
{
    int i, Entry;
    Vec_IntForEachEntry( vLevel, Entry, i )
        Vec_IntPushUnique( vNodeFrames, Entry );
    Vec_IntSort( vNodeFrames, 0 );
}